

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

bool __thiscall
cmStandardLevelResolver::HaveStandardAvailable
          (cmStandardLevelResolver *this,cmGeneratorTarget *target,string *lang,string *config,
          string *feature)

{
  cmMakefile *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  iterator iVar4;
  cmValue level;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  cmValue cVar6;
  StandardNeeded SVar7;
  string *args_1;
  string e;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  iVar4 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
          ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
                  *)lang,(key_type *)target);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
      ._M_cur != (__node_type *)0x0) {
    this_00 = this->Makefile;
    local_90.View_._M_len = 6;
    local_90.View_._M_str = "CMAKE_";
    local_60.View_._M_str =
         *(char **)((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                          ._M_cur + 0x28);
    local_60.View_._M_len =
         *(size_t *)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                 ._M_cur + 0x30);
    cmStrCat<char[18]>(&e,&local_90,&local_60,(char (*) [18])"_STANDARD_DEFAULT");
    level = cmMakefile::GetDefinition(this_00,&e);
    std::__cxx11::string::~string((string *)&e);
    if (level.Value == (string *)0x0) {
      local_90.View_._M_len = 6;
      local_90.View_._M_str = "CMAKE_";
      local_60.View_._M_str =
           *(char **)((long)iVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                            ._M_cur + 0x28);
      local_60.View_._M_len =
           *(size_t *)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                   ._M_cur + 0x30);
      cmStrCat<char[96]>(&e,&local_90,&local_60,
                         (char (*) [96])
                         "_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
                        );
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,&e);
      std::__cxx11::string::~string((string *)&e);
      return true;
    }
    uVar1 = *(undefined8 *)
             ((long)iVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                    ._M_cur + 0x48);
    uVar2 = *(undefined8 *)
             ((long)iVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                    ._M_cur + 0x50);
    iVar3 = anon_unknown.dwarf_1549283::ParseStd(level.Value);
    local_90.View_._M_len._0_4_ = iVar3;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (uVar1,uVar2);
    if (_Var5._M_current ==
        *(int **)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                        ._M_cur + 0x50)) {
      local_90.View_._M_len = 10;
      local_90.View_._M_str = "The CMAKE_";
      local_60.View_._M_str =
           *(char **)((long)iVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                            ._M_cur + 0x28);
      local_60.View_._M_len =
           *(size_t *)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                   ._M_cur + 0x30);
      cmStrCat<char[56],std::__cxx11::string,char[3]>
                (&e,&local_90,&local_60,
                 (char (*) [56])"_STANDARD_DEFAULT variable contains an invalid value: \"",
                 level.Value,(char (*) [3])0x67b310);
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,&e);
    }
    else {
      cVar6 = cmGeneratorTarget::GetLanguageStandard
                        (target,(string *)
                                ((long)iVar4.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                       ._M_cur + 0x28),config);
      if (cVar6.Value != (string *)0x0) {
        level = cVar6;
      }
      uVar1 = *(undefined8 *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x48);
      uVar2 = *(undefined8 *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x50);
      iVar3 = anon_unknown.dwarf_1549283::ParseStd(level.Value);
      local_90.View_._M_len = CONCAT44(local_90.View_._M_len._4_4_,iVar3);
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (uVar1,uVar2);
      if (_Var5._M_current !=
          *(int **)((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                          ._M_cur + 0x50)) {
        SVar7 = anon_unknown.dwarf_1549283::StandardLevelComputer::HighestStandardNeeded
                          ((StandardLevelComputer *)
                           ((long)iVar4.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                  ._M_cur + 0x28),this_00,feature);
        if (SVar7.index == -1) {
          return true;
        }
        return (int *)((long)SVar7.index * 4 +
                      *(long *)((long)iVar4.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                      ._M_cur + 0x48)) <= _Var5._M_current;
      }
      local_90.View_._M_len = 4;
      local_90.View_._M_str = "The ";
      local_60.View_._M_str =
           *(char **)((long)iVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                            ._M_cur + 0x28);
      local_60.View_._M_len =
           *(size_t *)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                   ._M_cur + 0x30);
      args_1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmStrCat<char[31],std::__cxx11::string,char[32],std::__cxx11::string,char[3]>
                (&e,&local_90,&local_60,(char (*) [31])"_STANDARD property on target \"",args_1,
                 (char (*) [32])"\" contained an invalid value: \"",level.Value,
                 (char (*) [3])0x67b310);
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&e);
    }
    std::__cxx11::string::~string((string *)&e);
  }
  return false;
}

Assistant:

bool cmStandardLevelResolver::HaveStandardAvailable(
  cmGeneratorTarget const* target, std::string const& lang,
  std::string const& config, const std::string& feature) const
{
  auto mapping = StandardComputerMapping.find(lang);
  if (mapping != cm::cend(StandardComputerMapping)) {
    return mapping->second.HaveStandardAvailable(this->Makefile, target,
                                                 config, feature);
  }
  return false;
}